

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

Block * __thiscall wasm::Builder::blockify(Builder *this,Expression *any,Expression *append)

{
  Block *pBVar1;
  _Storage<wasm::Type,_true> local_38;
  undefined1 local_30;
  Block *local_28;
  Block *block;
  Expression *append_local;
  Expression *any_local;
  Builder *this_local;
  
  local_28 = (Block *)0x0;
  block = (Block *)append;
  append_local = any;
  any_local = (Expression *)this;
  if (any != (Expression *)0x0) {
    local_28 = Expression::dynCast<wasm::Block>(any);
  }
  if (local_28 == (Block *)0x0) {
    local_28 = makeBlock(this,append_local);
  }
  if (block != (Block *)0x0) {
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(local_28->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)block);
    pBVar1 = local_28;
    std::optional<wasm::Type>::optional((optional<wasm::Type> *)&local_38);
    ::wasm::Block::finalize(pBVar1,local_38,local_30,0);
  }
  return local_28;
}

Assistant:

Block* blockify(Expression* any, Expression* append = nullptr) {
    Block* block = nullptr;
    if (any) {
      block = any->dynCast<Block>();
    }
    if (!block) {
      block = makeBlock(any);
    }
    if (append) {
      block->list.push_back(append);
      block->finalize();
    }
    return block;
  }